

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

SingleCallStatistics *
deqp::gles3::Performance::anon_unknown_1::calculateSampleStatistics
          (SingleCallStatistics *__return_storage_ptr__,LineParametersWithConfidence *fit,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          *samples)

{
  pointer pUVar1;
  ulong uVar2;
  long lVar3;
  size_type __n;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  allocator_type local_51;
  _Vector_base<float,_std::allocator<float>_> local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_50);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 5;
  lVar3 = 0;
  uVar5 = 0;
  if (0 < (int)__n) {
    uVar5 = __n & 0xffffffff;
  }
  for (; uVar5 * 8 != lVar3; lVar3 = lVar3 + 8) {
    *(undefined8 *)((long)local_38._M_impl.super__Vector_impl_data._M_start + lVar3) =
         *(undefined8 *)((long)&(pUVar1->duration).fitResponseDuration + lVar3 * 4);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_50,__n,&local_51);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 5;
  uVar4 = 0;
  uVar5 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 4 != uVar4; uVar4 = uVar4 + 4) {
    *(float *)((long)local_50._M_impl.super__Vector_impl_data._M_start + uVar4) =
         (float)(&pUVar1->writtenSize)[uVar4 * 2] /
         (((float)*(ulong *)((long)local_38._M_impl.super__Vector_impl_data._M_start + uVar4 * 2) /
          1000.0) / 1000.0);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_finish);
  fVar6 = linearSample<float>((vector<float,_std::allocator<float>_> *)&local_50,0.5);
  __return_storage_ptr__->medianRate = fVar6;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_50);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_50,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_51);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 5;
  uVar4 = 0;
  uVar5 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 4 != uVar4; uVar4 = uVar4 + 4) {
    *(float *)((long)local_50._M_impl.super__Vector_impl_data._M_start + uVar4) =
         (float)*(ulong *)((long)local_38._M_impl.super__Vector_impl_data._M_start + uVar4 * 2) -
         ((float)(&pUVar1->writtenSize)[uVar4 * 2] * fit->coefficient + fit->offset);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_finish);
  __return_storage_ptr__->maxDiffTime = local_50._M_impl.super__Vector_impl_data._M_finish[-1];
  fVar6 = linearSample<float>((vector<float,_std::allocator<float>_> *)&local_50,0.9);
  __return_storage_ptr__->maxDiff9DecileTime = fVar6;
  fVar6 = linearSample<float>((vector<float,_std::allocator<float>_> *)&local_50,0.5);
  __return_storage_ptr__->medianDiffTime = fVar6;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_50);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_50,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_51);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 5;
  uVar4 = 0;
  uVar5 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 4 != uVar4; uVar4 = uVar4 + 4) {
    fVar6 = (float)(&pUVar1->writtenSize)[uVar4 * 2] * fit->coefficient + fit->offset;
    fVar7 = 0.0;
    if (1.0 <= fVar6) {
      fVar7 = ((float)*(ulong *)((long)local_38._M_impl.super__Vector_impl_data._M_start + uVar4 * 2
                                ) - fVar6) / fVar6;
    }
    *(float *)((long)local_50._M_impl.super__Vector_impl_data._M_start + uVar4) = fVar7;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_finish);
  __return_storage_ptr__->maxRelDiffTime = local_50._M_impl.super__Vector_impl_data._M_finish[-1];
  fVar6 = linearSample<float>((vector<float,_std::allocator<float>_> *)&local_50,0.9);
  __return_storage_ptr__->max9DecileRelDiffTime = fVar6;
  fVar6 = linearSample<float>((vector<float,_std::allocator<float>_> *)&local_50,0.5);
  __return_storage_ptr__->medianRelDiffTime = fVar6;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_50);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_38._M_impl.super__Vector_impl_data._M_start,
             local_38._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->result).minTime =
       (float)*local_38._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->result).maxTime =
       (float)local_38._M_impl.super__Vector_impl_data._M_finish[-1];
  fVar6 = linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,0.5);
  (__return_storage_ptr__->result).medianTime = fVar6;
  fVar6 = linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,0.1);
  (__return_storage_ptr__->result).min2DecileTime = fVar6;
  fVar6 = linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,0.9);
  (__return_storage_ptr__->result).max9DecileTime = fVar6;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static SingleCallStatistics calculateSampleStatistics (const LineParametersWithConfidence& fit, const std::vector<UploadSampleResult<SingleOperationDuration> >& samples)
{
	SingleCallStatistics stats;

	calculateBasicTransferStatistics(stats, fit, samples);

	return stats;
}